

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O1

bool __thiscall
irr::video::COpenGLSLMaterialRenderer::setPixelShaderConstant
          (COpenGLSLMaterialRenderer *this,s32 index,u32 *ints,int count)

{
  int iVar1;
  GLenum GVar2;
  pointer pSVar3;
  code *pcVar4;
  int iVar5;
  
  if (-1 < index) {
    pSVar3 = (this->UniformInfo).m_data.
             super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = pSVar3[(uint)index].location;
    if (-1 < iVar1) {
      GVar2 = pSVar3[(uint)index].type;
      if ((int)GVar2 < 0x8dc7) {
        if (GVar2 == 0x1405) {
          pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x840);
          if (pcVar4 == (code *)0x0) {
            return true;
          }
        }
        else {
          if (GVar2 != 0x8dc6) {
            return false;
          }
          pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x848);
          if (pcVar4 == (code *)0x0) {
            return true;
          }
          count = count / 2;
        }
      }
      else if (GVar2 == 0x8dc7) {
        pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x850);
        if (pcVar4 == (code *)0x0) {
          return true;
        }
        count = count / 3;
      }
      else {
        if (GVar2 != 0x8dc8) {
          return false;
        }
        pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x858);
        if (pcVar4 == (code *)0x0) {
          return true;
        }
        iVar5 = count + 3;
        if (-1 < count) {
          iVar5 = count;
        }
        count = iVar5 >> 2;
      }
      (*pcVar4)(iVar1,count);
      return true;
    }
  }
  return false;
}

Assistant:

bool COpenGLSLMaterialRenderer::setPixelShaderConstant(s32 index, const u32 *ints, int count)
{
	if (index < 0 || UniformInfo[index].location < 0)
		return false;

	bool status = true;

	switch (UniformInfo[index].type) {
	case GL_UNSIGNED_INT:
		Driver->extGlUniform1uiv(UniformInfo[index].location, count, reinterpret_cast<const GLuint *>(ints));
		break;
#if defined(GL_VERSION_3_0)
	case GL_UNSIGNED_INT_VEC2:
		Driver->extGlUniform2uiv(UniformInfo[index].location, count / 2, reinterpret_cast<const GLuint *>(ints));
		break;
	case GL_UNSIGNED_INT_VEC3:
		Driver->extGlUniform3uiv(UniformInfo[index].location, count / 3, reinterpret_cast<const GLuint *>(ints));
		break;
	case GL_UNSIGNED_INT_VEC4:
		Driver->extGlUniform4uiv(UniformInfo[index].location, count / 4, reinterpret_cast<const GLuint *>(ints));
		break;
#endif
	default:
		status = false;
		break;
	}
	return status;
}